

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

logical ga_locate_nnodes_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,
                         Integer *np)

{
  logical lVar1;
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_00000490;
  Integer *in_stack_00000498;
  Integer *in_stack_000004a0;
  Integer in_stack_000004a8;
  
  lVar1 = pnga_locate_nnodes(in_stack_000004a8,in_stack_000004a0,in_stack_00000498,in_stack_00000490
                            );
  return lVar1;
}

Assistant:

logical FATR ga_locate_nnodes_( Integer *g_a,
                                Integer *ilo,
                                Integer *ihi,
                                Integer *jlo,
                                Integer *jhi,
                                Integer *np)
{
  Integer lo[2], hi[2];
  lo[0] = *ilo;
  lo[1] = *jlo;
  hi[0] = *ihi;
  hi[1] = *jhi;
  return wnga_locate_nnodes(*g_a, lo, hi, np);
}